

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool boost::ext::ut::v1_1_8::detail::
     on<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,boost::ext::ut::v1_1_8::events::assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
               (assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *event)

{
  assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  assertion;
  bool bVar1;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_10;
  assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *event_local;
  
  local_10 = event;
  memcpy(&local_48,event,0x38);
  assertion.expr.lhs_._M_str = (char *)uStack_40;
  assertion.expr.lhs_._M_len = local_48;
  assertion.expr.rhs_._M_len = uStack_38;
  assertion.expr.rhs_._M_str = (char *)uStack_30;
  assertion.expr._32_8_ = uStack_28;
  assertion.location.file_ = (char *)uStack_20;
  assertion.location._8_8_ = uStack_18;
  bVar1 = runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>::
          on<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
                    ((runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *
                     )cfg<boost::ext::ut::v1_1_8::override>,assertion);
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}